

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-inequalities-01.cpp
# Opt level: O3

int __thiscall
baryonyx::itm::
solver_inequalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>
::select_variables(solver_inequalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>
                   *this,int r_size,int bkmin,int bkmax)

{
  longdouble lVar1;
  longdouble lVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  bool bVar8;
  bool bVar9;
  double dVar10;
  
  iVar3 = bkmin;
  if (r_size < bkmin) {
    iVar3 = r_size;
  }
  iVar4 = iVar3;
  if (bkmin != bkmax) {
    iVar5 = bkmax;
    if (r_size < bkmax) {
      iVar5 = r_size;
    }
    iVar4 = iVar5;
    if (iVar3 <= bkmax) {
      if (bkmin < r_size) {
        r_size = bkmin;
      }
      iVar6 = iVar3;
      if (iVar3 < iVar5) {
        iVar6 = iVar5;
      }
      iVar6 = r_size + iVar6;
      lVar7 = (long)r_size << 5;
      do {
        lVar1 = *(longdouble *)
                 ((long)&((this->R)._M_t.
                          super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>::rc_data[]>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>::rc_data[]>_>
                          .
                          super__Head_base<0UL,_baryonyx::itm::solver_inequalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>::rc_data_*,_false>
                         ._M_head_impl)->value + lVar7);
        lVar2 = (longdouble)0;
        bVar9 = lVar1 == lVar2;
        bVar8 = lVar1 < lVar2;
        if ((bVar9) && (!NAN(lVar1) && !NAN(lVar2))) {
          dVar10 = std::
                   generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                             (this->rng);
          bVar9 = dVar10 == 0.5;
          bVar8 = 0.5 < dVar10;
        }
        iVar4 = r_size;
        if (!bVar8 && !bVar9) break;
        r_size = r_size + 1;
        lVar7 = lVar7 + 0x20;
        iVar4 = iVar5;
      } while ((iVar6 - iVar3) + 1 != r_size);
    }
  }
  return iVar4 + -1;
}

Assistant:

int select_variables(const int r_size, int bkmin, int bkmax)
    {
        if (bkmin == bkmax)
            return std::min(bkmin, r_size) - 1;

        bkmin = std::min(bkmin, r_size);
        bkmax = std::min(bkmax, r_size);

        for (int i = bkmin; i <= bkmax; ++i)
            if (stop_iterating<Mode>(R[i].value, rng))
                return i - 1;

        return bkmax - 1;
    }